

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

void Internal_TextStyleInit
               (wchar_t *name,ON_UUID id,int index,ON_Font *font,ON_TextStyle *text_style)

{
  bool bVar1;
  ON_wString font_description;
  ON_wString local_40;
  
  ON_wString::ON_wString(&local_40);
  if (font != (ON_Font *)0x0) {
    ON_Font::Description((ON_Font *)&stack0xffffffffffffffc8);
    ON_wString::operator=(&local_40,(ON_wString *)&stack0xffffffffffffffc8);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
    ON_TextStyle::SetFont(text_style,font);
    if ((name == (wchar_t *)0x0) || (*name == L'\0')) {
      bVar1 = ON_wString::IsNotEmpty(&local_40);
      if (bVar1) {
        name = ON_wString::operator_cast_to_wchar_t_(&local_40);
        bVar1 = true;
        goto LAB_005be92f;
      }
    }
  }
  bVar1 = false;
LAB_005be92f:
  Internal_SystemModelComponentInit(id,index,name,&text_style->super_ON_ModelComponent);
  if (bVar1) {
    ON_ModelComponent::LockName(&text_style->super_ON_ModelComponent);
  }
  ON_wString::~ON_wString(&local_40);
  return;
}

Assistant:

static void Internal_TextStyleInit(
  const wchar_t* name,
  ON_UUID id,
  int index,
  const ON_Font* font,
  ON_TextStyle& text_style
  )
{
  ON_wString font_description;
  bool bLockName = false;
  if (nullptr != font)
  {
    font_description = font->Description();
    text_style.SetFont(font);

    if ( (nullptr == name || 0 == name[0]) && font_description.IsNotEmpty() )
    {
      name = font_description;
      bLockName = true;
    }
  }

  Internal_SystemModelComponentInit(id, index, name, text_style);

  if (bLockName)
    text_style.LockName();
}